

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68000_andi_to_ccr(m68k_info *info)

{
  ulong uVar1;
  uint64_t uVar2;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar2 = 0xaa;
  if (uVar1 + 2 <= info->code_len) {
    uVar2 = (uint64_t)info->code[uVar1 + 1];
  }
  info->pc = info->pc + 2;
  MCInst_setOpcode(info->inst,8);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x1;
  (info->extension).operands[0].type = M68K_OP_IMM;
  (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
  (info->extension).operands[0].field_0.imm = uVar2;
  (info->extension).operands[1].address_mode = M68K_AM_NONE;
  (info->extension).operands[1].field_0.simm = 3.78351e-44;
  return;
}

Assistant:

static void d68000_andi_to_ccr(m68k_info *info)
{
	build_imm_special_reg(info, M68K_INS_ANDI, read_imm_8(info), 1, M68K_REG_CCR);
}